

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O3

bool __thiscall duckdb_re2::DFA::PossibleMatchRange(DFA *this,string *min,string *max,int maxlen)

{
  _Hash_node_base *p_Var1;
  __node_base _Var2;
  bool bVar3;
  mapped_type *pmVar4;
  State *pSVar5;
  State *pSVar6;
  int j;
  int iVar7;
  uint uVar8;
  int j_1;
  State *s;
  MutexLock lock;
  RWLocker l;
  unordered_map<duckdb_re2::DFA::State_*,_int,_std::hash<duckdb_re2::DFA::State_*>,_std::equal_to<duckdb_re2::DFA::State_*>,_std::allocator<std::pair<duckdb_re2::DFA::State_*const,_int>_>_>
  previously_visited_states;
  State *local_f0;
  uint local_e4;
  ulong local_e0;
  MutexLock local_d8;
  RWLocker local_d0;
  _Hashtable<duckdb_re2::DFA::State_*,_std::pair<duckdb_re2::DFA::State_*const,_int>,_std::allocator<std::pair<duckdb_re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<duckdb_re2::DFA::State_*>,_std::hash<duckdb_re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_c0;
  SearchParams local_88;
  
  if (this->init_failed_ != false) {
    return false;
  }
  local_c0._M_buckets = &local_c0._M_single_bucket;
  local_c0._M_bucket_count = 1;
  local_c0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_c0._M_element_count = 0;
  local_c0._M_rehash_policy._M_max_load_factor = 1.0;
  local_c0._M_rehash_policy._M_next_resize = 0;
  local_c0._M_single_bucket = (__node_base_ptr)0x0;
  RWLocker::RWLocker(&local_d0,&this->cache_mutex_);
  local_88.text.data_ = (const_pointer)0x0;
  local_88.text.size_ = 0;
  local_88.start = (State *)0x0;
  local_88.context.data_ = (const_pointer)0x0;
  local_88.context.size_ = 0;
  local_88.failed = false;
  local_88.ep = (char *)0x0;
  local_88.matches = (SparseSet *)0x0;
  local_88.anchored = true;
  local_88.can_prefix_accel = false;
  local_88.want_earliest_match = false;
  local_88.run_forward = false;
  local_88.cache_lock = &local_d0;
  bVar3 = AnalyzeSearch(this,&local_88);
  pSVar6 = local_88.start;
  if ((!bVar3) || (local_88.start == (State *)0x2)) {
    bVar3 = false;
    goto LAB_01830561;
  }
  if (local_88.start == (State *)&DAT_00000001) {
    std::__cxx11::string::_M_replace((ulong)min,0,(char *)min->_M_string_length,0x1ecb9c3);
    bVar3 = true;
    std::__cxx11::string::_M_replace((ulong)max,0,(char *)max->_M_string_length,0x1ecb9c3);
    goto LAB_01830561;
  }
  local_f0 = local_88.start;
  min->_M_string_length = 0;
  *(min->_M_dataplus)._M_p = '\0';
  MutexLock::MutexLock(&local_d8,&this->mutex_);
  local_e4 = maxlen;
  _Var2._M_nxt = local_c0._M_before_begin._M_nxt;
  if (0 < maxlen) {
    local_e0 = 0;
    while (pmVar4 = std::__detail::
                    _Map_base<duckdb_re2::DFA::State_*,_std::pair<duckdb_re2::DFA::State_*const,_int>,_std::allocator<std::pair<duckdb_re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<duckdb_re2::DFA::State_*>,_std::hash<duckdb_re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<duckdb_re2::DFA::State_*,_std::pair<duckdb_re2::DFA::State_*const,_int>,_std::allocator<std::pair<duckdb_re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<duckdb_re2::DFA::State_*>,_std::hash<duckdb_re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&local_c0,&local_f0),
          _Var2._M_nxt = local_c0._M_before_begin._M_nxt, *pmVar4 < 1) {
      pmVar4 = std::__detail::
               _Map_base<duckdb_re2::DFA::State_*,_std::pair<duckdb_re2::DFA::State_*const,_int>,_std::allocator<std::pair<duckdb_re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<duckdb_re2::DFA::State_*>,_std::hash<duckdb_re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<duckdb_re2::DFA::State_*,_std::pair<duckdb_re2::DFA::State_*const,_int>,_std::allocator<std::pair<duckdb_re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<duckdb_re2::DFA::State_*>,_std::hash<duckdb_re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_c0,&local_f0);
      *pmVar4 = *pmVar4 + 1;
      pSVar5 = RunStateOnByte(this,local_f0,0x100);
      if (pSVar5 != (State *)&DAT_00000001) {
        if (pSVar5 == (State *)0x0) goto LAB_01830785;
        _Var2._M_nxt = local_c0._M_before_begin._M_nxt;
        if ((pSVar5 == (State *)0x2) || ((pSVar5->flag_ & 0x100) != 0)) break;
      }
      iVar7 = 0;
      while( true ) {
        pSVar5 = RunStateOnByte(this,local_f0,iVar7);
        if (pSVar5 == (State *)0x0) goto LAB_01830785;
        if ((pSVar5 == (State *)0x2) || (((State *)0x2 < pSVar5 && (0 < pSVar5->ninst_)))) break;
        iVar7 = iVar7 + 1;
        _Var2._M_nxt = local_c0._M_before_begin._M_nxt;
        if (iVar7 == 0x100) goto joined_r0x01830694;
      }
      std::__cxx11::string::_M_replace_aux((ulong)min,min->_M_string_length,0,'\x01');
      uVar8 = (int)local_e0 + 1;
      local_e0 = (ulong)uVar8;
      local_f0 = pSVar5;
      _Var2._M_nxt = local_c0._M_before_begin._M_nxt;
      if (uVar8 == local_e4) break;
    }
  }
joined_r0x01830694:
  while (_Var2._M_nxt != (_Hash_node_base *)0x0) {
    p_Var1 = (_Var2._M_nxt)->_M_nxt;
    operator_delete(_Var2._M_nxt);
    _Var2._M_nxt = p_Var1;
  }
  uVar8 = 0;
  switchD_012e3010::default(local_c0._M_buckets,0,local_c0._M_bucket_count << 3);
  local_c0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_c0._M_element_count = 0;
  local_f0 = pSVar6;
  max->_M_string_length = 0;
  *(max->_M_dataplus)._M_p = '\0';
  if (0 < (int)local_e4) {
    do {
      pmVar4 = std::__detail::
               _Map_base<duckdb_re2::DFA::State_*,_std::pair<duckdb_re2::DFA::State_*const,_int>,_std::allocator<std::pair<duckdb_re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<duckdb_re2::DFA::State_*>,_std::hash<duckdb_re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<duckdb_re2::DFA::State_*,_std::pair<duckdb_re2::DFA::State_*const,_int>,_std::allocator<std::pair<duckdb_re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<duckdb_re2::DFA::State_*>,_std::hash<duckdb_re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_c0,&local_f0);
      if (0 < *pmVar4) break;
      pmVar4 = std::__detail::
               _Map_base<duckdb_re2::DFA::State_*,_std::pair<duckdb_re2::DFA::State_*const,_int>,_std::allocator<std::pair<duckdb_re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<duckdb_re2::DFA::State_*>,_std::hash<duckdb_re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<duckdb_re2::DFA::State_*,_std::pair<duckdb_re2::DFA::State_*const,_int>,_std::allocator<std::pair<duckdb_re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<duckdb_re2::DFA::State_*>,_std::hash<duckdb_re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_c0,&local_f0);
      *pmVar4 = *pmVar4 + 1;
      iVar7 = 0xff;
      while( true ) {
        pSVar6 = RunStateOnByte(this,local_f0,iVar7);
        if (pSVar6 == (State *)0x0) goto LAB_01830785;
        if ((pSVar6 == (State *)0x2) || (((State *)0x2 < pSVar6 && (0 < pSVar6->ninst_)))) break;
        bVar3 = iVar7 == 0;
        iVar7 = iVar7 + -1;
        if (bVar3) {
          bVar3 = true;
          goto LAB_0183078c;
        }
      }
      std::__cxx11::string::_M_replace_aux((ulong)max,max->_M_string_length,0,'\x01');
      uVar8 = uVar8 + 1;
      local_f0 = pSVar6;
    } while (uVar8 != local_e4);
  }
  PrefixSuccessor(max);
  bVar3 = max->_M_string_length != 0;
LAB_0183078c:
  MutexLock::~MutexLock(&local_d8);
LAB_01830561:
  RWLocker::~RWLocker(&local_d0);
  std::
  _Hashtable<duckdb_re2::DFA::State_*,_std::pair<duckdb_re2::DFA::State_*const,_int>,_std::allocator<std::pair<duckdb_re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<duckdb_re2::DFA::State_*>,_std::hash<duckdb_re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_c0);
  return bVar3;
LAB_01830785:
  bVar3 = false;
  goto LAB_0183078c;
}

Assistant:

bool DFA::PossibleMatchRange(std::string* min, std::string* max, int maxlen) {
  if (!ok())
    return false;

  // NOTE: if future users of PossibleMatchRange want more precision when
  // presented with infinitely repeated elements, consider making this a
  // parameter to PossibleMatchRange.
  static int kMaxEltRepetitions = 0;

  // Keep track of the number of times we've visited states previously. We only
  // revisit a given state if it's part of a repeated group, so if the value
  // portion of the map tuple exceeds kMaxEltRepetitions we bail out and set
  // |*max| to |PrefixSuccessor(*max)|.
  //
  // Also note that previously_visited_states[UnseenStatePtr] will, in the STL
  // tradition, implicitly insert a '0' value at first use. We take advantage
  // of that property below.
  std::unordered_map<State*, int> previously_visited_states;

  // Pick out start state for anchored search at beginning of text.
  RWLocker l(&cache_mutex_);
  SearchParams params(StringPiece(), StringPiece(), &l);
  params.anchored = true;
  if (!AnalyzeSearch(&params))
    return false;
  if (params.start == DeadState) {  // No matching strings
    *min = "";
    *max = "";
    return true;
  }
  if (params.start == FullMatchState)  // Every string matches: no max
    return false;

  // The DFA is essentially a big graph rooted at params.start,
  // and paths in the graph correspond to accepted strings.
  // Each node in the graph has potentially 256+1 arrows
  // coming out, one for each byte plus the magic end of
  // text character kByteEndText.

  // To find the smallest possible prefix of an accepted
  // string, we just walk the graph preferring to follow
  // arrows with the lowest bytes possible.  To find the
  // largest possible prefix, we follow the largest bytes
  // possible.

  // The test for whether there is an arrow from s on byte j is
  //    ns = RunStateOnByteUnlocked(s, j);
  //    if (ns == NULL)
  //      return false;
  //    if (ns != DeadState && ns->ninst > 0)
  // The RunStateOnByteUnlocked call asks the DFA to build out the graph.
  // It returns NULL only if the DFA has run out of memory,
  // in which case we can't be sure of anything.
  // The second check sees whether there was graph built
  // and whether it is interesting graph.  Nodes might have
  // ns->ninst == 0 if they exist only to represent the fact
  // that a match was found on the previous byte.

  // Build minimum prefix.
  State* s = params.start;
  min->clear();
  MutexLock lock(&mutex_);
  for (int i = 0; i < maxlen; i++) {
    if (previously_visited_states[s] > kMaxEltRepetitions)
      break;
    previously_visited_states[s]++;

    // Stop if min is a match.
    State* ns = RunStateOnByte(s, kByteEndText);
    if (ns == NULL)  // DFA out of memory
      return false;
    if (ns != DeadState && (ns == FullMatchState || ns->IsMatch()))
      break;

    // Try to extend the string with low bytes.
    bool extended = false;
    for (int j = 0; j < 256; j++) {
      ns = RunStateOnByte(s, j);
      if (ns == NULL)  // DFA out of memory
        return false;
      if (ns == FullMatchState ||
          (ns > SpecialStateMax && ns->ninst_ > 0)) {
        extended = true;
        min->append(1, static_cast<char>(j));
        s = ns;
        break;
      }
    }
    if (!extended)
      break;
  }

  // Build maximum prefix.
  previously_visited_states.clear();
  s = params.start;
  max->clear();
  for (int i = 0; i < maxlen; i++) {
    if (previously_visited_states[s] > kMaxEltRepetitions)
      break;
    previously_visited_states[s] += 1;

    // Try to extend the string with high bytes.
    bool extended = false;
    for (int j = 255; j >= 0; j--) {
      State* ns = RunStateOnByte(s, j);
      if (ns == NULL)
        return false;
      if (ns == FullMatchState ||
          (ns > SpecialStateMax && ns->ninst_ > 0)) {
        extended = true;
        max->append(1, static_cast<char>(j));
        s = ns;
        break;
      }
    }
    if (!extended) {
      // Done, no need for PrefixSuccessor.
      return true;
    }
  }

  // Stopped while still adding to *max - round aaaaaaaaaa... to aaaa...b
  PrefixSuccessor(max);

  // If there are no bytes left, we have no way to say "there is no maximum
  // string".  We could make the interface more complicated and be able to
  // return "there is no maximum but here is a minimum", but that seems like
  // overkill -- the most common no-max case is all possible strings, so not
  // telling the caller that the empty string is the minimum match isn't a
  // great loss.
  if (max->empty())
    return false;

  return true;
}